

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O3

VarValue *
deqp::gles31::Functional::getSamplerFillValue(VarValue *__return_storage_ptr__,VarValue *sampler)

{
  undefined8 uVar1;
  uint uVar2;
  VarValue *pVVar4;
  VarValue *pVVar3;
  
  uVar2 = sampler->type - TYPE_SAMPLER_2D;
  pVVar3 = (VarValue *)(ulong)uVar2;
  pVVar4 = pVVar3;
  if (uVar2 < 0x19) {
    pVVar4 = (VarValue *)
             ((long)&switchD_0154d6a6::switchdataD_01c6f634 +
             (long)(int)(&switchD_0154d6a6::switchdataD_01c6f634)[(long)pVVar3]);
    switch(pVVar3) {
    case (VarValue *)0x0:
    case (VarValue *)0x1:
    case (VarValue *)0x3:
    case (VarValue *)0x4:
      __return_storage_ptr__->type = TYPE_FLOAT_VEC4;
      break;
    default:
      goto switchD_0154d6a6_caseD_2;
    case (VarValue *)0x7:
    case (VarValue *)0x8:
    case (VarValue *)0xa:
      __return_storage_ptr__->type = TYPE_FLOAT;
      (__return_storage_ptr__->val).floatV[0] = (sampler->val).floatV[1];
      return pVVar4;
    case (VarValue *)0xd:
    case (VarValue *)0xe:
    case (VarValue *)0x10:
    case (VarValue *)0x11:
      __return_storage_ptr__->type = TYPE_INT_VEC4;
      break;
    case (VarValue *)0x14:
    case (VarValue *)0x15:
    case (VarValue *)0x17:
    case (VarValue *)0x18:
      __return_storage_ptr__->type = TYPE_UINT_VEC4;
    }
    uVar1 = *(undefined8 *)((long)&sampler->val + 0xc);
    *(undefined8 *)&__return_storage_ptr__->val = *(undefined8 *)((long)&sampler->val + 4);
    *(undefined8 *)((long)&__return_storage_ptr__->val + 8) = uVar1;
    return pVVar4;
  }
switchD_0154d6a6_caseD_2:
  __return_storage_ptr__->type = TYPE_LAST;
  return pVVar4;
}

Assistant:

static VarValue getSamplerFillValue (const VarValue& sampler)
{
	DE_ASSERT(glu::isDataTypeSampler(sampler.type));

	VarValue result;
	result.type = getSamplerLookupReturnType(sampler.type);

	switch (result.type)
	{
		case glu::TYPE_FLOAT_VEC4:
			for (int i = 0; i < 4; i++)
				result.val.floatV[i] = sampler.val.samplerV.fillColor.floatV[i];
			break;
		case glu::TYPE_UINT_VEC4:
			for (int i = 0; i < 4; i++)
				result.val.uintV[i] = sampler.val.samplerV.fillColor.uintV[i];
			break;
		case glu::TYPE_INT_VEC4:
			for (int i = 0; i < 4; i++)
				result.val.intV[i] = sampler.val.samplerV.fillColor.intV[i];
			break;
		case glu::TYPE_FLOAT:
			result.val.floatV[0] = sampler.val.samplerV.fillColor.floatV[0];
			break;
		default:
			DE_ASSERT(false);
	}

	return result;
}